

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true> __thiscall
duckdb::PhysicalTopN::GetGlobalSinkState(PhysicalTopN *this,ClientContext *context)

{
  _func_int **in_RAX;
  DynamicFilterData *this_00;
  ClientContext *in_RDX;
  _func_int **local_28;
  
  local_28 = in_RAX;
  if ((context->config).profiler_settings._M_h._M_rehash_policy._M_next_resize != 0) {
    this_00 = shared_ptr<duckdb::DynamicFilterData,_true>::operator->
                        ((shared_ptr<duckdb::DynamicFilterData,_true> *)
                         &(context->config).profiler_settings._M_h._M_rehash_policy._M_next_resize);
    DynamicFilterData::Reset(this_00);
  }
  make_uniq<duckdb::TopNGlobalSinkState,duckdb::ClientContext&,duckdb::PhysicalTopN_const&>
            ((duckdb *)&local_28,in_RDX,(PhysicalTopN *)context);
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = local_28;
  return (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)
         (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)this;
}

Assistant:

unique_ptr<GlobalSinkState> PhysicalTopN::GetGlobalSinkState(ClientContext &context) const {
	if (dynamic_filter) {
		dynamic_filter->Reset();
	}
	return make_uniq<TopNGlobalSinkState>(context, *this);
}